

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBFileStream.cpp
# Opt level: O2

void __thiscall TPZBFileStream::ReadData<unsigned_int>(TPZBFileStream *this,uint *p,int howMany)

{
  std::istream::read((char *)&this->fIn,(long)p);
  return;
}

Assistant:

void TPZBFileStream::ReadData(T *p, int howMany) {
    fIn.read(reinterpret_cast<char *>(p), howMany * sizeof(T));
#ifdef PZDEBUG
    if (fIn.bad()) {
        PZError << "TBFileStream:Could not read from stream" << std::endl;
        DebugStop();
    }
#endif
}